

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * Cudd_addNonSimCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  bool bVar4;
  uint uVar5;
  DdNode *pDVar6;
  DdNode *cube;
  DdNode *g;
  ulong uVar7;
  DdNode *pDVar8;
  ulong uVar9;
  uint lastsub;
  
  cube = dd->one;
  piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 2;
  pDVar8 = cube;
  g = cube;
  uVar9 = (long)dd->size;
  pDVar6 = cube;
  if (0 < (long)dd->size) {
    do {
      pDVar3 = vector[uVar9 - 1];
      if (((uVar9 - 1 != (ulong)pDVar3->index) || ((pDVar3->type).kids.T != dd->one)) ||
         (pDVar6 = pDVar8, cube = g, (pDVar3->type).kids.E != dd->zero)) {
        pDVar6 = Cudd_addIthVar(dd,(int)uVar9 + -1);
        if (pDVar6 == (DdNode *)0x0) {
LAB_007fef2e:
          pDVar6 = g;
          Cudd_RecursiveDeref(dd,pDVar8);
        }
        else {
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          cube = Cudd_addApply(dd,Cudd_addTimes,pDVar6,g);
          if (cube == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar8);
            pDVar8 = g;
          }
          else {
            piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g);
            g = Cudd_addApply(dd,Cudd_addXnor,pDVar6,vector[uVar9 - 1]);
            if (g != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,pDVar6);
              pDVar6 = Cudd_addApply(dd,Cudd_addTimes,pDVar8,g);
              if (pDVar6 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDeref(dd,pDVar8);
                Cudd_RecursiveDeref(dd,g);
                goto LAB_007fee3e;
              }
              goto LAB_007fef2e;
            }
          }
          Cudd_RecursiveDeref(dd,pDVar8);
        }
        Cudd_RecursiveDeref(dd,pDVar6);
        return (DdNode *)0x0;
      }
LAB_007fee3e:
      bVar4 = 1 < (long)uVar9;
      pDVar8 = pDVar6;
      g = cube;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  do {
    uVar2 = dd->size;
    uVar7 = (ulong)uVar2;
    uVar9 = uVar7;
    while( true ) {
      uVar9 = uVar9 - 1;
      uVar5 = (uint)uVar7;
      lastsub = (int)uVar2 >> 0x1f & uVar2;
      if (((int)uVar5 < 1) || (pDVar8 = vector[uVar9], lastsub = uVar5, uVar9 != pDVar8->index))
      break;
      if (((pDVar8->type).kids.T != dd->one) ||
         (uVar7 = (ulong)(uVar5 - 1), (pDVar8->type).kids.E != dd->zero)) break;
    }
    dd->reordered = 0;
    pDVar8 = cuddAddNonSimComposeRecur(dd,f,vector,pDVar6,cube,lastsub);
    if (pDVar8 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    if (dd->reordered != 1) {
      Cudd_RecursiveDeref(dd,pDVar6);
      Cudd_RecursiveDeref(dd,cube);
      if (pDVar8 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
      return pDVar8;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addNonSimCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdNode              *cube, *key, *var, *tmp, *piece;
    DdNode              *res;
    int                 i, lastsub;

    /* The cache entry for this function is composed of three parts:
    ** f itself, the replacement relation, and the cube of the
    ** variables being substituted.
    ** The replacement relation is the product of the terms (yi EXNOR gi).
    ** This apporach allows us to use the global cache for this function,
    ** with great savings in memory with respect to using arrays for the
    ** cache entries.
    ** First we build replacement relation and cube of substituted
    ** variables from the vector specifying the desired composition.
    */
    key = DD_ONE(dd);
    cuddRef(key);
    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = (int) dd->size - 1; i >= 0; i--) {
        if (ddIsIthAddVar(dd,vector[i],(unsigned int)i)) {
            continue;
        }
        var = Cudd_addIthVar(dd,i);
        if (var == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(var);
        /* Update cube. */
        tmp = Cudd_addApply(dd,Cudd_addTimes,var,cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
        /* Update replacement relation. */
        piece = Cudd_addApply(dd,Cudd_addXnor,var,vector[i]);
        if (piece == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(piece);
        Cudd_RecursiveDeref(dd,var);
        tmp = Cudd_addApply(dd,Cudd_addTimes,key,piece);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,piece);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,piece);
        key = tmp;
    }

    /* Now try composition, until no reordering occurs. */
    do {
        /* Find real substitution with largest index. */
        for (lastsub = dd->size - 1; lastsub >= 0; lastsub--) {
            if (!ddIsIthAddVar(dd,vector[lastsub],(unsigned int)lastsub)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        dd->reordered = 0;
        res = cuddAddNonSimComposeRecur(dd,f,vector,key,cube,lastsub+1);
        if (res != NULL) cuddRef(res);

    } while (dd->reordered == 1);

    Cudd_RecursiveDeref(dd,key);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    return(res);

}